

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
xemmai::t_parser::f_block
          (t_parser *this,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes)

{
  size_t this_00;
  bool bVar1;
  pointer pwVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  undefined1 local_28 [16];
  size_t indent;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *a_nodes_local;
  t_parser *this_local;
  
  indent = (size_t)a_nodes;
  a_nodes_local =
       (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
        *)this;
  local_28._8_8_ = t_lexer::f_indent(&this->v_lexer);
  do {
    this_00 = indent;
    f_expression((t_parser *)local_28);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ::push_back((vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                 *)this_00,(value_type *)local_28);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_28);
    bVar1 = t_lexer::f_newline(&this->v_lexer);
    if (!bVar1) {
      bVar3 = sv(L"expecting newline.",0x12);
      f_throw(this,bVar3);
    }
    pwVar2 = (pointer)t_lexer::f_indent(&this->v_lexer);
  } while (pwVar2 == (pointer)local_28._8_8_);
  pwVar2 = (pointer)t_lexer::f_indent(&this->v_lexer);
  if ((ulong)local_28._8_8_ < pwVar2) {
    bVar3 = sv(L"unexpected indent.",0x12);
    f_throw(this,bVar3);
  }
  return;
}

Assistant:

void t_parser::f_block(std::vector<std::unique_ptr<ast::t_node>>& a_nodes)
{
	size_t indent = v_lexer.f_indent();
	do {
		a_nodes.push_back(f_expression());
		if (!v_lexer.f_newline()) f_throw(L"expecting newline."sv);
	} while (v_lexer.f_indent() == indent);
	if (v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
}